

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

uint64_t art_allocate_index(art_t *art,art_typecode_t typecode)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  uint64_t uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = CONCAT71(in_register_00000031,typecode) & 0xffffffff;
  uVar1 = art->first_free[uVar7];
  uVar5 = art->capacities[uVar7];
  iVar3 = (int)CONCAT71(in_register_00000031,typecode);
  if (uVar1 == uVar5) {
    if (uVar5 == 0) {
      uVar9 = 2;
    }
    else if (uVar5 < 0x400) {
      uVar9 = uVar5 * 2;
    }
    else {
      uVar9 = uVar5 * 5 >> 2;
    }
    uVar8 = (ulong)(uint)(iVar3 * 8);
    *(ulong *)((long)art->capacities + uVar8) = uVar9;
    lVar2 = *(long *)((long)ART_NODE_SIZES + uVar8);
    pvVar4 = roaring_realloc(*(void **)((long)art->nodes + uVar8),lVar2 * uVar9);
    *(void **)((long)art->nodes + uVar8) = pvVar4;
    memset((void *)((uVar5 & 0xffffffffffff) * lVar2 + (long)pvVar4),0,(uVar9 - uVar5) * lVar2);
    if (uVar5 < uVar9) {
      do {
        uVar8 = uVar5 + 1;
        if ((byte)(typecode - 1) < 5) {
          *(ulong *)((long)art->nodes[uVar7] + (uVar5 & 0xffffffffffff) * lVar2) = uVar8;
        }
        uVar5 = uVar8;
      } while (uVar9 != uVar8);
    }
    uVar6 = art->first_free[uVar7] + 1;
  }
  else if (typecode - 1 < 5) {
    uVar5 = (ulong)(uint)(iVar3 * 8);
    uVar6 = *(uint64_t *)
             (*(long *)((long)art->nodes + uVar5) +
             (uVar1 & 0xffffffffffff) * *(long *)((long)ART_NODE_SIZES + uVar5));
  }
  else {
    uVar6 = 0;
  }
  art->first_free[uVar7] = uVar6;
  return uVar1;
}

Assistant:

static uint64_t art_allocate_index(art_t *art, art_typecode_t typecode) {
    uint64_t first_free = art->first_free[typecode];
    if (first_free == art->capacities[typecode]) {
        art_extend(art, typecode);
        art->first_free[typecode]++;
        return first_free;
    }
    art->first_free[typecode] = art_next_free(art, typecode);
    return first_free;
}